

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner_unix.cpp
# Opt level: O2

void __thiscall trun::DirScanner::CheckAddFile(DirScanner *this,string *filename)

{
  bool bVar1;
  char *__s;
  string ext;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  GetExtension(&local_38,this,filename);
  bVar1 = IsExtensionOk(this,&local_38);
  if (bVar1) {
    __s = realpath((filename->_M_dataplus)._M_p,(char *)0x0);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->filenames,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void DirScanner::CheckAddFile(std::string &filename) {
    std::string ext = GetExtension(filename);
    if (IsExtensionOk(ext)) {
        // Need proper path to file
        char *fullPath = realpath(filename.c_str(),NULL);
        if (fullPath != nullptr) {
            filenames.push_back(std::string(fullPath));
        }
    }
}